

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

bool glcts::verifyResultImage<int,4u,3u,3u>
               (GLuint n_mipmap_levels,GLuint n_layers,
               _func_void_GLuint_GLint_GLint_GLint_GLint_int_ptr *getComponents,GLubyte *data)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  GLuint pixel;
  long lVar5;
  GLuint layer;
  GLuint GVar6;
  GLuint face;
  int iVar7;
  vector<int,_std::allocator<int>_> expected_values;
  int components [4];
  uint local_7c;
  _Vector_base<int,_std::allocator<int>_> local_68;
  int local_48 [6];
  
  local_68._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&local_68,(ulong)(n_layers * 0xd8));
  uVar2 = 0;
  for (GVar6 = 0; GVar6 != n_layers; GVar6 = GVar6 + 1) {
    local_7c = uVar2;
    for (iVar7 = 0; iVar7 != 6; iVar7 = iVar7 + 1) {
      uVar4 = local_7c;
      for (lVar5 = 0; lVar5 != 9; lVar5 = lVar5 + 1) {
        (*getComponents)((GLuint)lVar5,iVar7,GVar6,n_layers,n_mipmap_levels,local_48);
        for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
          local_68._M_impl.super__Vector_impl_data._M_start[(ulong)uVar4 + lVar3] = local_48[lVar3];
        }
        uVar4 = uVar4 + 4;
      }
      local_7c = local_7c + 0x24;
    }
    uVar2 = uVar2 + 0xd8;
  }
  bVar1 = verifyImage<int,4u,3u,3u>
                    ((int *)data,local_68._M_impl.super__Vector_impl_data._M_start,n_layers);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  return bVar1;
}

Assistant:

bool verifyResultImage(glw::GLuint n_mipmap_levels, glw::GLuint n_layers,
					   void (*getComponents)(glw::GLuint pixel_index, glw::GLint cube_face, glw::GLint layer_index,
											 glw::GLint n_layers, glw::GLint n_mipmap_levels, T* out_components),
					   const glw::GLubyte* data)
{
	const glw::GLuint n_components			= N_Components;
	const glw::GLuint face_width			= Width;
	const glw::GLuint face_height			= Height;
	const glw::GLuint n_pixels_per_face		= face_width * face_height;
	const glw::GLuint n_components_per_face = n_pixels_per_face * n_components;
	const glw::GLuint n_faces				= 6;
	const glw::GLuint n_total_faces			= n_layers * n_faces;
	const glw::GLuint n_total_components	= n_total_faces * n_components_per_face;
	const T*		  result_image			= (const T*)data;

	std::vector<T> expected_values;
	expected_values.resize(n_total_components);

	for (glw::GLuint layer = 0; layer < n_layers; ++layer)
	{
		const glw::GLuint layer_offset = layer * n_faces * n_components_per_face;

		for (glw::GLuint face = 0; face < n_faces; ++face)
		{
			const glw::GLuint face_offset = face * n_components_per_face + layer_offset;

			for (glw::GLuint pixel = 0; pixel < n_pixels_per_face; ++pixel)
			{
				const glw::GLuint pixel_offset = pixel * n_components + face_offset;

				T components[n_components];

				getComponents(pixel, face, layer, n_layers, n_mipmap_levels, components);

				for (glw::GLuint component = 0; component < n_components; ++component)
				{
					const glw::GLuint component_offset = pixel_offset + component;

					expected_values[component_offset] = components[component];
				}
			}
		}
	}

	return verifyImage<T, N_Components, Width, Height>(result_image, &expected_values[0], n_layers);
}